

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETALATTICE::ReadConfiguration(EnvironmentNAVXYTHETALATTICE *this,FILE *fCfg)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  ulong uVar5;
  void *pvVar6;
  SBPL_Exception *this_00;
  undefined8 in_RSI;
  long in_RDI;
  double dVar7;
  stringstream ss_7;
  stringstream ss_6;
  stringstream ss_5;
  stringstream ss_4;
  stringstream ss_3;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  int y;
  int x;
  int dTemp;
  char sTemp1 [1024];
  char sTemp [1024];
  string *in_stack_ffffffffffffe7b8;
  SBPL_Exception *in_stack_ffffffffffffe7c0;
  int local_1804;
  int local_17f4;
  int local_17c4;
  int local_17b4;
  stringstream local_1590 [16];
  ostream local_1580 [383];
  undefined1 local_1401;
  stringstream local_13e0 [16];
  ostream local_13d0 [383];
  undefined1 local_1251;
  stringstream local_1230 [16];
  ostream local_1220 [383];
  undefined1 local_10a1;
  stringstream local_1080 [16];
  ostream local_1070 [383];
  undefined1 local_ef1;
  stringstream local_ed0 [16];
  ostream local_ec0 [383];
  undefined1 local_d41;
  stringstream local_d20 [16];
  ostream local_d10 [383];
  undefined1 local_b91;
  stringstream local_b70 [16];
  ostream local_b60 [383];
  undefined1 local_9e1;
  stringstream local_9c0 [16];
  ostream local_9b0 [396];
  int local_824;
  int local_820;
  undefined1 local_81c [4];
  char local_818 [1024];
  char local_418 [1032];
  undefined8 local_10;
  
  local_10 = in_RSI;
  iVar2 = __isoc99_fscanf(in_RSI,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  strcpy(local_818,"discretization(cells):");
  iVar2 = strcmp(local_818,local_418);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_9c0);
    poVar4 = std::operator<<(local_9b0,
                             "ERROR: configuration file has incorrect format (discretization)");
    poVar4 = std::operator<<(poVar4," Expected ");
    poVar4 = std::operator<<(poVar4,local_818);
    poVar4 = std::operator<<(poVar4," got ");
    std::operator<<(poVar4,local_418);
    local_9e1 = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    local_9e1 = 0;
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = atoi(local_418);
  *(int *)(in_RDI + 0x28) = iVar2;
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = atoi(local_418);
  *(int *)(in_RDI + 0x2c) = iVar2;
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  strcpy(local_818,"NumThetaDirs:");
  iVar2 = strcmp(local_818,local_418);
  if (iVar2 == 0) {
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 != 1) {
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    iVar2 = atoi(local_418);
    *(int *)(in_RDI + 0x30) = iVar2;
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 != 1) {
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    strcpy(local_818,"obsthresh:");
    iVar2 = strcmp(local_818,local_418);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_d20);
      poVar4 = std::operator<<(local_d10,"ERROR: configuration file has incorrect format");
      poVar4 = std::operator<<(poVar4," Expected ");
      poVar4 = std::operator<<(poVar4,local_818);
      poVar4 = std::operator<<(poVar4," got ");
      poVar4 = std::operator<<(poVar4,local_418);
      std::operator<<(poVar4," see existing examples of env files for the right format of heading");
      local_d41 = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
      local_d41 = 0;
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
  }
  else {
    strcpy(local_818,"obsthresh:");
    iVar2 = strcmp(local_818,local_418);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_b70);
      poVar4 = std::operator<<(local_b60,"ERROR: configuration file has incorrect format");
      poVar4 = std::operator<<(poVar4," Expected ");
      poVar4 = std::operator<<(poVar4,local_818);
      poVar4 = std::operator<<(poVar4," got ");
      std::operator<<(poVar4,local_418);
      local_b91 = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
      local_b91 = 0;
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    *(undefined4 *)(in_RDI + 0x30) = 0x10;
  }
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = atoi(local_418);
  *(char *)(in_RDI + 0x88) = (char)iVar2;
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  strcpy(local_818,"cost_inscribed_thresh:");
  iVar2 = strcmp(local_818,local_418);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_ed0);
    poVar4 = std::operator<<(local_ec0,"ERROR: configuration file has incorrect format");
    poVar4 = std::operator<<(poVar4," Expected ");
    poVar4 = std::operator<<(poVar4,local_818);
    poVar4 = std::operator<<(poVar4," got ");
    poVar4 = std::operator<<(poVar4,local_418);
    std::operator<<(poVar4," see existing examples of env files for the right format of heading");
    local_ef1 = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    local_ef1 = 0;
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = atoi(local_418);
  *(char *)(in_RDI + 0x89) = (char)iVar2;
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  strcpy(local_818,"cost_possibly_circumscribed_thresh:");
  iVar2 = strcmp(local_818,local_418);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1080);
    poVar4 = std::operator<<(local_1070,"ERROR: configuration file has incorrect format");
    poVar4 = std::operator<<(poVar4," Expected ");
    poVar4 = std::operator<<(poVar4,local_818);
    poVar4 = std::operator<<(poVar4," got ");
    poVar4 = std::operator<<(poVar4,local_418);
    std::operator<<(poVar4," see existing examples of env files for the right format of heading");
    local_10a1 = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    local_10a1 = 0;
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = atoi(local_418);
  *(int *)(in_RDI + 0x8c) = iVar2;
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 != 1) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  strcpy(local_818,"cellsize(meters):");
  iVar2 = strcmp(local_818,local_418);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1230);
    poVar4 = std::operator<<(local_1220,"ERROR: configuration file has incorrect format");
    poVar4 = std::operator<<(poVar4," Expected ");
    poVar4 = std::operator<<(poVar4,local_818);
    poVar4 = std::operator<<(poVar4," got ");
    std::operator<<(poVar4,local_418);
    local_1251 = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
    local_1251 = 0;
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
  if (iVar2 == 1) {
    dVar7 = atof(local_418);
    *(double *)(in_RDI + 0xa0) = dVar7;
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 != 1) {
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    strcpy(local_818,"nominalvel(mpersecs):");
    iVar2 = strcmp(local_818,local_418);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_13e0);
      poVar4 = std::operator<<(local_13d0,"ERROR: configuration file has incorrect format");
      poVar4 = std::operator<<(poVar4," Expected ");
      poVar4 = std::operator<<(poVar4,local_818);
      poVar4 = std::operator<<(poVar4," got ");
      std::operator<<(poVar4,local_418);
      local_1401 = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
      local_1401 = 0;
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 != 1) {
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    dVar7 = atof(local_418);
    *(double *)(in_RDI + 0x90) = dVar7;
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 != 1) {
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    strcpy(local_818,"timetoturn45degsinplace(secs):");
    iVar2 = strcmp(local_818,local_418);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_1590);
      poVar4 = std::operator<<(local_1580,"ERROR: configuration file has incorrect format");
      poVar4 = std::operator<<(poVar4," Expected ");
      poVar4 = std::operator<<(poVar4,local_818);
      poVar4 = std::operator<<(poVar4," got ");
      std::operator<<(poVar4,local_418);
      uVar3 = __cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 != 1) {
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    dVar7 = atof(local_418);
    *(double *)(in_RDI + 0x98) = dVar7;
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 != 1) {
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
    if (iVar2 == 1) {
      dVar7 = atof(local_418);
      if (dVar7 < 0.0) {
        dVar7 = atof(local_418);
        local_17b4 = (int)(dVar7 / *(double *)(in_RDI + 0xa0)) + -1;
      }
      else {
        dVar7 = atof(local_418);
        local_17b4 = (int)(dVar7 / *(double *)(in_RDI + 0xa0));
      }
      *(int *)(in_RDI + 0x34) = local_17b4;
      iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
      if (iVar2 != 1) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      dVar7 = atof(local_418);
      if (dVar7 < 0.0) {
        dVar7 = atof(local_418);
        local_17c4 = (int)(dVar7 / *(double *)(in_RDI + 0xa0)) + -1;
      }
      else {
        dVar7 = atof(local_418);
        local_17c4 = (int)(dVar7 / *(double *)(in_RDI + 0xa0));
      }
      *(int *)(in_RDI + 0x38) = local_17c4;
      iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
      if (iVar2 != 1) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      dVar7 = atof(local_418);
      *(double *)(in_RDI + 0x70) = dVar7;
      if ((*(int *)(in_RDI + 0x34) < 0) || (*(int *)(in_RDI + 0x28) <= *(int *)(in_RDI + 0x34))) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      if ((*(int *)(in_RDI + 0x38) < 0) || (*(int *)(in_RDI + 0x2c) <= *(int *)(in_RDI + 0x38))) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
      if (iVar2 != 1) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
      if (iVar2 != 1) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      dVar7 = atof(local_418);
      if (dVar7 < 0.0) {
        dVar7 = atof(local_418);
        local_17f4 = (int)(dVar7 / *(double *)(in_RDI + 0xa0)) + -1;
      }
      else {
        dVar7 = atof(local_418);
        local_17f4 = (int)(dVar7 / *(double *)(in_RDI + 0xa0));
      }
      *(int *)(in_RDI + 0x40) = local_17f4;
      iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
      if (iVar2 != 1) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      dVar7 = atof(local_418);
      if (dVar7 < 0.0) {
        dVar7 = atof(local_418);
        local_1804 = (int)(dVar7 / *(double *)(in_RDI + 0xa0)) + -1;
      }
      else {
        dVar7 = atof(local_418);
        local_1804 = (int)(dVar7 / *(double *)(in_RDI + 0xa0));
      }
      *(int *)(in_RDI + 0x44) = local_1804;
      iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
      if (iVar2 != 1) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      dVar7 = atof(local_418);
      *(double *)(in_RDI + 0x78) = dVar7;
      if ((*(int *)(in_RDI + 0x40) < 0) || (*(int *)(in_RDI + 0x28) <= *(int *)(in_RDI + 0x40))) {
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      if ((-1 < *(int *)(in_RDI + 0x44)) && (*(int *)(in_RDI + 0x44) < *(int *)(in_RDI + 0x2c))) {
        if (*(long *)(in_RDI + 0x50) != 0) {
          for (local_820 = 0; local_820 < *(int *)(in_RDI + 0x28); local_820 = local_820 + 1) {
            pvVar6 = *(void **)(*(long *)(in_RDI + 0x50) + (long)local_820 * 8);
            if (pvVar6 != (void *)0x0) {
              operator_delete__(pvVar6);
            }
          }
          if (*(void **)(in_RDI + 0x50) != (void *)0x0) {
            operator_delete__(*(void **)(in_RDI + 0x50));
          }
          *(undefined8 *)(in_RDI + 0x50) = 0;
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)*(int *)(in_RDI + 0x28);
        uVar5 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        pvVar6 = operator_new__(uVar5);
        *(void **)(in_RDI + 0x50) = pvVar6;
        for (local_820 = 0; local_820 < *(int *)(in_RDI + 0x28); local_820 = local_820 + 1) {
          pvVar6 = operator_new__((long)*(int *)(in_RDI + 0x2c));
          *(void **)(*(long *)(in_RDI + 0x50) + (long)local_820 * 8) = pvVar6;
        }
        iVar2 = __isoc99_fscanf(local_10,"%s",local_418);
        if (iVar2 == 1) {
          local_824 = 0;
          do {
            if (*(int *)(in_RDI + 0x2c) <= local_824) {
              return;
            }
            for (local_820 = 0; local_820 < *(int *)(in_RDI + 0x28); local_820 = local_820 + 1) {
              iVar2 = __isoc99_fscanf(local_10,"%d",local_81c);
              if (iVar2 != 1) {
                this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                SBPL_Exception::SBPL_Exception(this_00,(char *)in_stack_ffffffffffffe7b8);
                __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
              }
              *(char *)(*(long *)(*(long *)(in_RDI + 0x50) + (long)local_820 * 8) + (long)local_824)
                   = local_81c[0];
            }
            local_824 = local_824 + 1;
          } while( true );
        }
        uVar3 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
        __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      uVar3 = __cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
      __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  uVar3 = __cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffe7c0,(char *)in_stack_ffffffffffffe7b8);
  __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::ReadConfiguration(FILE* fCfg)
{
    // read in the configuration of environment and initialize
    // EnvNAVXYTHETALATCfg structure
    char sTemp[1024], sTemp1[1024];
    int dTemp;
    int x, y;

    // discretization(cells)
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    strcpy(sTemp1, "discretization(cells):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format (discretization)" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    EnvNAVXYTHETALATCfg.EnvWidth_c = atoi(sTemp);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    EnvNAVXYTHETALATCfg.EnvHeight_c = atoi(sTemp);

    // Scan for optional NumThetaDirs parameter. Check for following obsthresh.
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "NumThetaDirs:");
    if (strcmp(sTemp1, sTemp) != 0) {
        // optional NumThetaDirs not available; default is NAVXYTHETALAT_THETADIRS (16)
        strcpy(sTemp1, "obsthresh:");
        if (strcmp(sTemp1, sTemp) != 0) {
            std::stringstream ss;
            ss << "ERROR: configuration file has incorrect format" <<
                    " Expected " << sTemp1 << " got " << sTemp;
            throw SBPL_Exception(ss.str());
        }
        else {
            EnvNAVXYTHETALATCfg.NumThetaDirs = NAVXYTHETALAT_THETADIRS;
        }
    }
    else {
        if (fscanf(fCfg, "%s", sTemp) != 1) {
            throw SBPL_Exception("ERROR: ran out of env file early (NumThetaDirs)");
        }
        EnvNAVXYTHETALATCfg.NumThetaDirs = atoi(sTemp);

        //obsthresh:
        if (fscanf(fCfg, "%s", sTemp) != 1) {
            throw SBPL_Exception("ERROR: ran out of env file early (obsthresh)");
        }
        strcpy(sTemp1, "obsthresh:");
        if (strcmp(sTemp1, sTemp) != 0) {
            std::stringstream ss;
            ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
            throw SBPL_Exception(ss.str());
        }
    }

    // obsthresh
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.obsthresh = atoi(sTemp);
    SBPL_PRINTF("obsthresh = %d\n", EnvNAVXYTHETALATCfg.obsthresh);

    //cost_inscribed_thresh:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cost_inscribed_thresh:");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cost_inscribed_thresh = atoi(sTemp);
    SBPL_PRINTF("cost_inscribed_thresh = %d\n", EnvNAVXYTHETALATCfg.cost_inscribed_thresh);

    //cost_possibly_circumscribed_thresh:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cost_possibly_circumscribed_thresh:");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh = atoi(sTemp);
    SBPL_PRINTF("cost_possibly_circumscribed_thresh = %d\n", EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh);

    //cellsize
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cellsize(meters):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cellsize_m = atof(sTemp);

    //speeds
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "nominalvel(mpersecs):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
            " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.nominalvel_mpersecs = atof(sTemp);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "timetoturn45degsinplace(secs):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs = atof(sTemp);

    // start(meters,rads):
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.StartX_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.StartY_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }

    EnvNAVXYTHETALATCfg.StartTheta_rad = atof(sTemp);

    if (EnvNAVXYTHETALATCfg.StartX_c < 0 ||
        EnvNAVXYTHETALATCfg.StartX_c >= EnvNAVXYTHETALATCfg.EnvWidth_c)
    {
        throw SBPL_Exception("ERROR: illegal start coordinates");
    }
    if (EnvNAVXYTHETALATCfg.StartY_c < 0 ||
        EnvNAVXYTHETALATCfg.StartY_c >= EnvNAVXYTHETALATCfg.EnvHeight_c)
    {
        throw SBPL_Exception("ERROR: illegal start coordinates");
    }

    // end(meters,rads):
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.EndX_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.EndY_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }

    EnvNAVXYTHETALATCfg.EndTheta_rad = atof(sTemp);

    if (EnvNAVXYTHETALATCfg.EndX_c < 0 ||
        EnvNAVXYTHETALATCfg.EndX_c >= EnvNAVXYTHETALATCfg.EnvWidth_c)
    {
        throw SBPL_Exception("ERROR: illegal end coordinates");
    }
    if (EnvNAVXYTHETALATCfg.EndY_c < 0 ||
        EnvNAVXYTHETALATCfg.EndY_c >= EnvNAVXYTHETALATCfg.EnvHeight_c)
    {
        throw SBPL_Exception("ERROR: illegal end coordinates");
    }

    // unallocate the 2d environment
    if (EnvNAVXYTHETALATCfg.Grid2D != NULL) {
        for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
            delete[] EnvNAVXYTHETALATCfg.Grid2D[x];
        }
        delete[] EnvNAVXYTHETALATCfg.Grid2D;
        EnvNAVXYTHETALATCfg.Grid2D = NULL;
    }

    // allocate the 2D environment
    EnvNAVXYTHETALATCfg.Grid2D = new unsigned char*[EnvNAVXYTHETALATCfg.EnvWidth_c];
    for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
        EnvNAVXYTHETALATCfg.Grid2D[x] = new unsigned char[EnvNAVXYTHETALATCfg.EnvHeight_c];
    }

    // environment:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    for (y = 0; y < EnvNAVXYTHETALATCfg.EnvHeight_c; y++) {
        for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
            if (fscanf(fCfg, "%d", &dTemp) != 1) {
                throw SBPL_Exception("ERROR: incorrect format of config file");
            }
            EnvNAVXYTHETALATCfg.Grid2D[x][y] = dTemp;
        }
    }
}